

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polpak.cpp
# Opt level: O0

bool i4_is_prime(int n)

{
  double dVar1;
  int local_14;
  int nhi;
  int i;
  int n_local;
  
  if (n < 1) {
    i._3_1_ = false;
  }
  else if (n < 4) {
    i._3_1_ = true;
  }
  else {
    dVar1 = sqrt((double)n);
    for (local_14 = 2; local_14 <= (int)dVar1; local_14 = local_14 + 1) {
      if (n % local_14 == 0) {
        return false;
      }
    }
    i._3_1_ = true;
  }
  return i._3_1_;
}

Assistant:

bool i4_is_prime ( int n )

//****************************************************************************80
//
//  Purpose:
//
//    I4_IS_PRIME reports whether an I4 is prime.
//
//  Method:
//
//    A simple, unoptimized sieve of Erasthosthenes is used to
//    check whether N can be divided by any integer between 2
//    and SQRT(N).
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    12 May 2003
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int N, the integer to be tested.
//
//    Output, bool I4_IS_PRIME, is TRUE if N is prime, and FALSE
//    otherwise.  Note that negative numbers and 0 are not
//    considered prime.
//
{
  int i;
  int nhi;

  if ( n <= 0 )
  {
    return false;
  }

  if ( n <= 3 )
  {
    return true;
  }

  nhi = int( sqrt ( double(n) ) );

  for ( i = 2; i <= nhi; i++ )
  {
    if ( ( n % i ) == 0 )
    {
      return false;
    }
  }

  return true;
}